

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O0

void HandleError(Status *status)

{
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  string errmsg;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  char *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  dbwrapper_error *this;
  char *in_stack_ffffffffffffff30;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff38;
  Status *in_stack_ffffffffffffff78;
  LogFlags in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  ConstevalFormatString<0U> in_stack_ffffffffffffffc8;
  string_view in_stack_ffffffffffffffd0;
  string_view in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = leveldb::Status::ok((Status *)
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (bVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    leveldb::Status::ToString_abi_cxx11_(in_stack_ffffffffffffff78);
    std::operator+(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    this = (dbwrapper_error *)&stack0xffffffffffffffd8;
    LogPrintFormatInternal<std::__cxx11::string>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd0,in_stack_ffffffffffffff8c,
               in_stack_ffffffffffffff80,(Level)errmsg._M_dataplus._M_p,
               (ConstevalFormatString<1U>)in_stack_ffffffffffffffc8.fmt,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               errmsg.field_2._M_allocated_capacity);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    msg = "You can use -debug=leveldb to get more complete diagnostic messages\n";
    LogPrintFormatInternal<>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd0,in_stack_ffffffffffffff8c,
               in_stack_ffffffffffffff80,(Level)errmsg._M_dataplus._M_p,in_stack_ffffffffffffffc8);
    uVar3 = __cxa_allocate_exception(0x10);
    dbwrapper_error::dbwrapper_error(this,(string *)msg);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&dbwrapper_error::typeinfo,dbwrapper_error::~dbwrapper_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

static void HandleError(const leveldb::Status& status)
{
    if (status.ok())
        return;
    const std::string errmsg = "Fatal LevelDB error: " + status.ToString();
    LogPrintf("%s\n", errmsg);
    LogPrintf("You can use -debug=leveldb to get more complete diagnostic messages\n");
    throw dbwrapper_error(errmsg);
}